

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitContBind(PrintExpressionContents *this,ContBind *curr)

{
  ostream *o;
  bool bVar1;
  HeapType HVar2;
  bool local_39;
  string_view local_28;
  ContBind *local_18;
  ContBind *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (ContBind *)this;
  bVar1 = wasm::Type::isContinuation(&curr->cont->type);
  local_39 = false;
  if (bVar1) {
    local_39 = wasm::Type::isContinuation
                         (&(local_18->super_SpecificExpression<(wasm::Expression::Id)91>).
                           super_Expression.type);
  }
  if (local_39 != false) {
    o = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"cont.bind ")
    ;
    printMedium(o,local_28);
    HVar2 = wasm::Type::getHeapType(&local_18->cont->type);
    printHeapTypeName(this,HVar2);
    std::operator<<(this->o,' ');
    HVar2 = wasm::Type::getHeapType
                      (&(local_18->super_SpecificExpression<(wasm::Expression::Id)91>).
                        super_Expression.type);
    printHeapTypeName(this,HVar2);
    return;
  }
  __assert_fail("curr->cont->type.isContinuation() && curr->type.isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                ,0x9f9,"void wasm::PrintExpressionContents::visitContBind(ContBind *)");
}

Assistant:

void visitContBind(ContBind* curr) {
    assert(curr->cont->type.isContinuation() && curr->type.isContinuation());
    printMedium(o, "cont.bind ");
    printHeapTypeName(curr->cont->type.getHeapType());
    o << ' ';
    printHeapTypeName(curr->type.getHeapType());
  }